

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::setActive(QMdiSubWindowPrivate *this,bool activate,bool changeFocus)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QMdiSubWindowPrivate *pQVar8;
  QMenuBar *pQVar9;
  QMdiSubWindowPrivate *pQVar10;
  QStyle *pQVar11;
  byte bVar12;
  byte in_DL;
  byte in_SIL;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int titleBarHeight;
  int frameWidth;
  QWidget *focusWidget;
  QMenuBar *mBar;
  QMdiSubWindow *q;
  QRegion windowDecoration;
  WindowStates oldWindowState_1;
  WindowStates oldWindowState;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int iVar13;
  undefined4 in_stack_ffffffffffffff5c;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff60;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff68;
  QFlagsStorage<Qt::WindowState> newstate;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff70;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  QRegion local_30;
  QRegion local_28;
  Int local_20;
  QFlagsStorageHelper<Qt::WindowState,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_18;
  QFlagsStorageHelper<Qt::WindowState,_4> local_14;
  Int local_10;
  QFlagsStorageHelper<Qt::WindowState,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar12 = in_SIL & 1;
  pQVar8 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  if ((*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 != 0) &&
     ((in_RDI->activationEnabled & 1U) != 0)) {
    if ((bVar12 == 0) ||
       (((in_RDI->isActive & 1U) != 0 || (bVar1 = QWidget::isEnabled((QWidget *)0x62daa6), !bVar1)))
       ) {
      if ((bVar12 == 0) && ((in_RDI->isActive & 1U) != 0)) {
        in_RDI->isActive = false;
        local_14.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa
        ;
        local_14.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QWidget::windowState
                       ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        newstate.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        in_stack_ffffffffffffff78 = pQVar8;
        local_18.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QWidget::windowState
                       ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        QFlags<Qt::WindowState>::operator&
                  ((QFlags<Qt::WindowState> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c.i);
        QWidget::overrideWindowState
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (WindowStates)newstate.i);
        if ((in_DL & 1) != 0) {
          storeFocusWidget((QMdiSubWindowPrivate *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          pQVar10 = (QMdiSubWindowPrivate *)QApplication::focusWidget();
          if ((pQVar10 != (QMdiSubWindowPrivate *)0x0) &&
             ((pQVar10 == pQVar8 ||
              (bVar1 = QWidget::isAncestorOf
                                 ((QWidget *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  (QWidget *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
              bVar1)))) {
            QWidget::clearFocus(in_stack_ffffffffffffff80);
          }
        }
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62dc46);
        if (bVar1) {
          in_stack_ffffffffffffff70 =
               (QMdiSubWindowPrivate *)QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62dc5d);
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62dc73);
          local_1c.super_QFlagsStorage<Qt::WindowState>.i =
               (QFlagsStorage<Qt::WindowState>)
               QWidget::windowState
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          QFlags<Qt::WindowState>::operator&
                    ((QFlags<Qt::WindowState> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c.i);
          QWidget::overrideWindowState
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (WindowStates)newstate.i);
        }
        local_20 = (Int)local_14.super_QFlagsStorage<Qt::WindowState>.i;
        in_stack_ffffffffffffff68 = pQVar8;
        QWidget::windowState
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        QMdiSubWindow::windowStateChanged
                  ((QMdiSubWindow *)0x62dce1,(WindowStates)in_stack_ffffffffffffff4c.i,
                   (WindowStates)in_stack_ffffffffffffff48.i);
      }
    }
    else {
      in_RDI->isActive = true;
      in_RDI->isExplicitlyDeactivated = false;
      local_c.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
      local_c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QWidget::windowState
                     ((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      ensureWindowState(in_stack_ffffffffffffff78,
                        (WindowState)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      QMdiSubWindow::aboutToActivate((QMdiSubWindow *)0x62daf9);
      pQVar9 = menuBar((QMdiSubWindowPrivate *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (pQVar9 != (QMenuBar *)0x0) {
        showButtonsInMenuBar(in_stack_ffffffffffffff78,(QMenuBar *)in_stack_ffffffffffffff70);
      }
      local_10 = (Int)local_c.super_QFlagsStorage<Qt::WindowState>.i;
      QWidget::windowState((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
      ;
      QMdiSubWindow::windowStateChanged
                ((QMdiSubWindow *)0x62db5a,(WindowStates)in_stack_ffffffffffffff4c.i,
                 (WindowStates)in_stack_ffffffffffffff48.i);
    }
    if ((((bVar12 != 0) && ((in_RDI->isActive & 1U) != 0)) &&
        (bVar1 = QWidget::isEnabled((QWidget *)0x62dd02), bVar1)) &&
       (bVar1 = QWidget::hasFocus((QWidget *)in_stack_ffffffffffffff68), !bVar1)) {
      in_stack_ffffffffffffff60 = pQVar8;
      QApplication::focusWidget();
      bVar1 = QWidget::isAncestorOf
                        ((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (!bVar1) {
        if ((in_DL & 1) != 0) {
          setFocusWidget(in_stack_ffffffffffffff70);
        }
        ensureWindowState(in_stack_ffffffffffffff78,
                          (WindowState)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      }
    }
    pQVar11 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff4c.i,in_stack_ffffffffffffff48.i));
    iVar2 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x2c,0,pQVar8);
    iVar3 = QMdiSubWindowPrivate::titleBarHeight(in_stack_ffffffffffffff68);
    local_28.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = QWidget::width((QWidget *)0x62dda3);
    iVar5 = QWidget::height((QWidget *)0x62ddb1);
    QRegion::QRegion(&local_28,0,0,iVar4,iVar5,Rectangle);
    iVar5 = iVar2;
    iVar13 = iVar3;
    iVar6 = QWidget::width((QWidget *)0x62dde8);
    iVar6 = iVar6 + iVar2 * -2;
    iVar7 = QWidget::height((QWidget *)0x62ddfe);
    QRegion::QRegion(&local_30,iVar5,iVar13,iVar6,(iVar7 - iVar3) - iVar2,Rectangle);
    QRegion::operator-=(&local_28,(QRegion *)&local_30);
    QRegion::~QRegion(&local_30);
    bVar1 = QBasicTimer::isActive(&in_RDI->resizeTimer);
    if (bVar1) {
      QBasicTimer::stop();
      updateDirtyRegions((QMdiSubWindowPrivate *)CONCAT44(iVar5,iVar4));
    }
    QWidget::update((QWidget *)in_stack_ffffffffffffff60,(QRegion *)CONCAT44(iVar6,iVar13));
    QRegion::~QRegion(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setActive(bool activate, bool changeFocus)
{
    Q_Q(QMdiSubWindow);
    if (!parent || !activationEnabled)
        return;

    if (activate && !isActive && q->isEnabled()) {
        isActive = true;
        isExplicitlyDeactivated = false;
        Qt::WindowStates oldWindowState = q->windowState();
        ensureWindowState(Qt::WindowActive);
        emit q->aboutToActivate();
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
#endif
        Q_ASSERT(isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    } else if (!activate && isActive) {
        isActive = false;
        Qt::WindowStates oldWindowState = q->windowState();
        q->overrideWindowState(q->windowState() & ~Qt::WindowActive);
        if (changeFocus) {
            storeFocusWidget();
            QWidget *focusWidget = QApplication::focusWidget();
            if (focusWidget && (focusWidget == q || q->isAncestorOf(focusWidget)))
                focusWidget->clearFocus();
        }
        if (baseWidget)
            baseWidget->overrideWindowState(baseWidget->windowState() & ~Qt::WindowActive);
        Q_ASSERT(!isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    }

    if (activate && isActive && q->isEnabled() && !q->hasFocus()
            && !q->isAncestorOf(QApplication::focusWidget())) {
        if (changeFocus)
            setFocusWidget();
        ensureWindowState(Qt::WindowActive);
    }

    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int titleBarHeight = this->titleBarHeight();
    QRegion windowDecoration = QRegion(0, 0, q->width(), q->height());
    windowDecoration -= QRegion(frameWidth, titleBarHeight, q->width() - 2 * frameWidth,
                                q->height() - titleBarHeight - frameWidth);

    // Make sure we don't use cached style options if we get
    // resize events right before activation/deactivation.
    if (resizeTimer.isActive()) {
        resizeTimer.stop();
        updateDirtyRegions();
    }

    q->update(windowDecoration);
}